

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O0

UText * __thiscall
icu_63::RegexMatcher::appendTail(RegexMatcher *this,UText *dest,UErrorCode *status)

{
  UBool UVar1;
  int64_t iVar2;
  UChar *dest_00;
  int64_t destLen_1;
  UChar *inputChars;
  int32_t len16;
  int64_t destLen;
  UErrorCode *status_local;
  UText *dest_local;
  RegexMatcher *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    UVar1 = ::U_FAILURE(this->fDeferredStatus);
    if (UVar1 == '\0') {
      if (this->fAppendPosition < this->fInputLength) {
        if (((this->fInputText->chunkNativeStart == 0) &&
            (this->fInputLength == this->fInputText->chunkNativeLimit)) &&
           (this->fInputLength == (long)this->fInputText->nativeIndexingLimit)) {
          iVar2 = utext_nativeLength_63(dest);
          utext_replace_63(dest,iVar2,iVar2,this->fInputText->chunkContents + this->fAppendPosition,
                           (int)this->fInputLength - (int)this->fAppendPosition,status);
        }
        else {
          if (this->fInputText->pFuncs->mapNativeIndexToUTF16 == (UTextMapNativeIndexToUTF16 *)0x0)
          {
            inputChars._4_4_ = (int)this->fInputLength - (int)this->fAppendPosition;
          }
          else {
            inputChars._4_4_ =
                 utext_extract_63(this->fInputText,this->fAppendPosition,this->fInputLength,
                                  (UChar *)0x0,0,status);
            *status = U_ZERO_ERROR;
          }
          dest_00 = (UChar *)uprv_malloc_63((long)inputChars._4_4_ << 1);
          if (dest_00 == (UChar *)0x0) {
            this->fDeferredStatus = U_MEMORY_ALLOCATION_ERROR;
          }
          else {
            utext_extract_63(this->fInputText,this->fAppendPosition,this->fInputLength,dest_00,
                             inputChars._4_4_,status);
            iVar2 = utext_nativeLength_63(dest);
            utext_replace_63(dest,iVar2,iVar2,dest_00,inputChars._4_4_,status);
            uprv_free_63(dest_00);
          }
        }
      }
    }
    else {
      *status = this->fDeferredStatus;
    }
  }
  return dest;
}

Assistant:

UText *RegexMatcher::appendTail(UText *dest, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return dest;
    }
    if (U_FAILURE(fDeferredStatus)) {
        status = fDeferredStatus;
        return dest;
    }

    if (fInputLength > fAppendPosition) {
        if (UTEXT_FULL_TEXT_IN_CHUNK(fInputText, fInputLength)) {
            int64_t destLen = utext_nativeLength(dest);
            utext_replace(dest, destLen, destLen, fInputText->chunkContents+fAppendPosition,
                          (int32_t)(fInputLength-fAppendPosition), &status);
        } else {
            int32_t len16;
            if (UTEXT_USES_U16(fInputText)) {
                len16 = (int32_t)(fInputLength-fAppendPosition);
            } else {
                len16 = utext_extract(fInputText, fAppendPosition, fInputLength, NULL, 0, &status);
                status = U_ZERO_ERROR; // buffer overflow
            }

            UChar *inputChars = (UChar *)uprv_malloc(sizeof(UChar)*(len16));
            if (inputChars == NULL) {
                fDeferredStatus = U_MEMORY_ALLOCATION_ERROR;
            } else {
                utext_extract(fInputText, fAppendPosition, fInputLength, inputChars, len16, &status); // unterminated
                int64_t destLen = utext_nativeLength(dest);
                utext_replace(dest, destLen, destLen, inputChars, len16, &status);
                uprv_free(inputChars);
            }
        }
    }
    return dest;
}